

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.hpp
# Opt level: O0

void __thiscall qclab::qgates::SWAP<double>::SWAP(SWAP<double> *this,int *qubits)

{
  int *qubits_local;
  SWAP<double> *this_local;
  
  QGate2<double>::QGate2(&this->super_QGate2<double>);
  (this->super_QGate2<double>).super_QObject<double>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0016cc58;
  (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[6])(this,qubits);
  return;
}

Assistant:

SWAP( const int* qubits )
        {
          setQubits( qubits ) ;
        }